

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_join_leave.cxx
# Opt level: O0

void __thiscall nuraft::raft_server::handle_join_cluster_resp(raft_server *this,resp_msg *resp)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  element_type *peVar4;
  resp_msg *in_RSI;
  long in_RDI;
  ulong in_stack_000002e8;
  raft_server *in_stack_000002f0;
  resp_msg *in_stack_ffffffffffffff18;
  shared_ptr<nuraft::peer> *in_stack_ffffffffffffff20;
  string *format;
  bool local_99;
  string local_98 [32];
  string local_78 [48];
  string local_48 [39];
  byte local_21;
  resp_msg *local_10;
  
  local_10 = in_RSI;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x3a0));
  local_21 = 0;
  local_99 = false;
  if (bVar1) {
    resp_msg::get_peer(in_stack_ffffffffffffff18);
    local_21 = 1;
    local_99 = std::operator==(in_stack_ffffffffffffff20,
                               (shared_ptr<nuraft::peer> *)in_stack_ffffffffffffff18);
  }
  if ((local_21 & 1) != 0) {
    std::shared_ptr<nuraft::peer>::~shared_ptr((shared_ptr<nuraft::peer> *)0x1e64ab);
  }
  if (local_99 == false) {
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
    if (bVar1) {
      peVar4 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1e66ee);
      iVar3 = (*peVar4->_vptr_logger[7])();
      if (2 < iVar3) {
        peVar4 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1e6711);
        format = local_98;
        msg_if_given_abi_cxx11_((char *)format,"no server to join, drop the message");
        (*peVar4->_vptr_logger[8])
                  (peVar4,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                   ,"handle_join_cluster_resp",0xd2,format);
        std::__cxx11::string::~string(local_98);
      }
    }
  }
  else {
    bVar1 = resp_msg::get_accepted(local_10);
    if (bVar1) {
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
      if (bVar1) {
        peVar4 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1e64f9);
        iVar3 = (*peVar4->_vptr_logger[7])();
        if (3 < iVar3) {
          peVar4 = std::
                   __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1e651c);
          std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     0x1e6532);
          uVar2 = peer::get_id((peer *)0x1e653a);
          msg_if_given_abi_cxx11_
                    ((char *)local_48,
                     "new server (%d) confirms it will join, start syncing logs to it",(ulong)uVar2)
          ;
          (*peVar4->_vptr_logger[8])
                    (peVar4,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                     ,"handle_join_cluster_resp",0xcb,local_48);
          std::__cxx11::string::~string(local_48);
        }
      }
      resp_msg::get_next_idx(local_10);
      sync_log_to_new_srv(in_stack_000002f0,in_stack_000002e8);
    }
    else {
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
      if (bVar1) {
        peVar4 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1e6604);
        iVar3 = (*peVar4->_vptr_logger[7])();
        if (2 < iVar3) {
          peVar4 = std::
                   __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1e6627);
          std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     0x1e663d);
          uVar2 = peer::get_id((peer *)0x1e6645);
          msg_if_given_abi_cxx11_
                    ((char *)local_78,"new server (%d) cannot accept the invitation, give up",
                     (ulong)uVar2);
          (*peVar4->_vptr_logger[8])
                    (peVar4,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                     ,"handle_join_cluster_resp",0xcf,local_78);
          std::__cxx11::string::~string(local_78);
        }
      }
    }
  }
  return;
}

Assistant:

void raft_server::handle_join_cluster_resp(resp_msg& resp) {
    if (srv_to_join_ && srv_to_join_ == resp.get_peer()) {
        if (resp.get_accepted()) {
            p_in("new server (%d) confirms it will join, "
                 "start syncing logs to it", srv_to_join_->get_id());
            sync_log_to_new_srv(resp.get_next_idx());
        } else {
            p_wn("new server (%d) cannot accept the invitation, give up",
                 srv_to_join_->get_id());
        }
    } else {
        p_wn("no server to join, drop the message");
    }
}